

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_Locale::ParseName
               (wchar_t *locale_name,int locale_name_element_count,wchar_t *language_code,
               size_t language_code_capacity,wchar_t *extlang_code,size_t extlang_code_capacity,
               wchar_t *script_code,size_t script_code_capacity,wchar_t *region_code,
               size_t region_code_capacity,wchar_t *sortorder,size_t sortorder_capacity)

{
  wchar_t wVar1;
  bool bVar2;
  char *locale_name_00;
  char acStack_1c8 [8];
  char ssortorder [64];
  char sregion_code [64];
  char sscript_code [64];
  char sextlang_code [64];
  char slanguage_code [64];
  size_t ON_S_CAPACITY;
  int local_6c;
  wchar_t w;
  int i;
  char *sname;
  ON_String local_50;
  ON_String buffer;
  size_t sStack_40;
  bool rc;
  size_t extlang_code_capacity_local;
  wchar_t *extlang_code_local;
  size_t language_code_capacity_local;
  wchar_t *language_code_local;
  wchar_t *pwStack_18;
  int locale_name_element_count_local;
  wchar_t *locale_name_local;
  
  buffer.m_s._7_1_ = 1;
  sStack_40 = extlang_code_capacity;
  extlang_code_capacity_local = (size_t)extlang_code;
  extlang_code_local = (wchar_t *)language_code_capacity;
  language_code_capacity_local = (size_t)language_code;
  language_code_local._4_4_ = locale_name_element_count;
  pwStack_18 = locale_name;
  bVar2 = ZeroWideBuffer((wchar_t **)&language_code_capacity_local,(size_t *)&extlang_code_local,4);
  if (!bVar2) {
    buffer.m_s._7_1_ = 0;
  }
  bVar2 = ZeroWideBuffer((wchar_t **)&extlang_code_capacity_local,&stack0xffffffffffffffc0,4);
  if (!bVar2) {
    buffer.m_s._7_1_ = 0;
  }
  bVar2 = ZeroWideBuffer(&script_code,&script_code_capacity,4);
  if (!bVar2) {
    buffer.m_s._7_1_ = 0;
  }
  bVar2 = ZeroWideBuffer(&region_code,&region_code_capacity,4);
  if (!bVar2) {
    buffer.m_s._7_1_ = 0;
  }
  bVar2 = ZeroWideBuffer(&sortorder,&sortorder_capacity,4);
  if (!bVar2) {
    buffer.m_s._7_1_ = 0;
  }
  if ((buffer.m_s._7_1_ & 1) == 0) {
    locale_name_local._7_1_ = 0;
  }
  else {
    if (language_code_local._4_4_ < 0) {
      language_code_local._4_4_ = ON_wString::Length(pwStack_18);
    }
    if (language_code_local._4_4_ == 0) {
      locale_name_local._7_1_ = 1;
    }
    else if ((pwStack_18 == (wchar_t *)0x0) || (*pwStack_18 == L'\0')) {
      locale_name_local._7_1_ = 0;
    }
    else if (language_code_local._4_4_ < 2) {
      locale_name_local._7_1_ = 0;
    }
    else {
      ON_String::ON_String(&local_50);
      ON_String::ReserveArray(&local_50,(long)language_code_local._4_4_);
      ON_String::SetLength(&local_50,(long)language_code_local._4_4_);
      locale_name_00 = ON_String::Array(&local_50);
      for (local_6c = 0; local_6c < language_code_local._4_4_; local_6c = local_6c + 1) {
        wVar1 = pwStack_18[local_6c];
        if (L'\x7f' < wVar1) {
          locale_name_local._7_1_ = 0;
          goto LAB_006b152f;
        }
        if (wVar1 == L'\0') {
          language_code_local._4_4_ = local_6c;
          break;
        }
        locale_name_00[local_6c] = (char)wVar1;
      }
      locale_name_00[language_code_local._4_4_] = '\0';
      sextlang_code[0x38] = '\0';
      sextlang_code[0x39] = '\0';
      sextlang_code[0x3a] = '\0';
      sextlang_code[0x3b] = '\0';
      sextlang_code[0x3c] = '\0';
      sextlang_code[0x3d] = '\0';
      sextlang_code[0x3e] = '\0';
      sextlang_code[0x3f] = '\0';
      sextlang_code[0x28] = '\0';
      sextlang_code[0x29] = '\0';
      sextlang_code[0x2a] = '\0';
      sextlang_code[0x2b] = '\0';
      sextlang_code[0x2c] = '\0';
      sextlang_code[0x2d] = '\0';
      sextlang_code[0x2e] = '\0';
      sextlang_code[0x2f] = '\0';
      sextlang_code[0x30] = '\0';
      sextlang_code[0x31] = '\0';
      sextlang_code[0x32] = '\0';
      sextlang_code[0x33] = '\0';
      sextlang_code[0x34] = '\0';
      sextlang_code[0x35] = '\0';
      sextlang_code[0x36] = '\0';
      sextlang_code[0x37] = '\0';
      sextlang_code[0x18] = '\0';
      sextlang_code[0x19] = '\0';
      sextlang_code[0x1a] = '\0';
      sextlang_code[0x1b] = '\0';
      sextlang_code[0x1c] = '\0';
      sextlang_code[0x1d] = '\0';
      sextlang_code[0x1e] = '\0';
      sextlang_code[0x1f] = '\0';
      sextlang_code[0x20] = '\0';
      sextlang_code[0x21] = '\0';
      sextlang_code[0x22] = '\0';
      sextlang_code[0x23] = '\0';
      sextlang_code[0x24] = '\0';
      sextlang_code[0x25] = '\0';
      sextlang_code[0x26] = '\0';
      sextlang_code[0x27] = '\0';
      sextlang_code[8] = '\0';
      sextlang_code[9] = '\0';
      sextlang_code[10] = '\0';
      sextlang_code[0xb] = '\0';
      sextlang_code[0xc] = '\0';
      sextlang_code[0xd] = '\0';
      sextlang_code[0xe] = '\0';
      sextlang_code[0xf] = '\0';
      sextlang_code[0x10] = '\0';
      sextlang_code[0x11] = '\0';
      sextlang_code[0x12] = '\0';
      sextlang_code[0x13] = '\0';
      sextlang_code[0x14] = '\0';
      sextlang_code[0x15] = '\0';
      sextlang_code[0x16] = '\0';
      sextlang_code[0x17] = '\0';
      sscript_code[0x38] = '\0';
      sscript_code[0x39] = '\0';
      sscript_code[0x3a] = '\0';
      sscript_code[0x3b] = '\0';
      sscript_code[0x3c] = '\0';
      sscript_code[0x3d] = '\0';
      sscript_code[0x3e] = '\0';
      sscript_code[0x3f] = '\0';
      sextlang_code[0] = '\0';
      sextlang_code[1] = '\0';
      sextlang_code[2] = '\0';
      sextlang_code[3] = '\0';
      sextlang_code[4] = '\0';
      sextlang_code[5] = '\0';
      sextlang_code[6] = '\0';
      sextlang_code[7] = '\0';
      sscript_code[0x28] = '\0';
      sscript_code[0x29] = '\0';
      sscript_code[0x2a] = '\0';
      sscript_code[0x2b] = '\0';
      sscript_code[0x2c] = '\0';
      sscript_code[0x2d] = '\0';
      sscript_code[0x2e] = '\0';
      sscript_code[0x2f] = '\0';
      sscript_code[0x30] = '\0';
      sscript_code[0x31] = '\0';
      sscript_code[0x32] = '\0';
      sscript_code[0x33] = '\0';
      sscript_code[0x34] = '\0';
      sscript_code[0x35] = '\0';
      sscript_code[0x36] = '\0';
      sscript_code[0x37] = '\0';
      sscript_code[0x18] = '\0';
      sscript_code[0x19] = '\0';
      sscript_code[0x1a] = '\0';
      sscript_code[0x1b] = '\0';
      sscript_code[0x1c] = '\0';
      sscript_code[0x1d] = '\0';
      sscript_code[0x1e] = '\0';
      sscript_code[0x1f] = '\0';
      sscript_code[0x20] = '\0';
      sscript_code[0x21] = '\0';
      sscript_code[0x22] = '\0';
      sscript_code[0x23] = '\0';
      sscript_code[0x24] = '\0';
      sscript_code[0x25] = '\0';
      sscript_code[0x26] = '\0';
      sscript_code[0x27] = '\0';
      sscript_code[8] = '\0';
      sscript_code[9] = '\0';
      sscript_code[10] = '\0';
      sscript_code[0xb] = '\0';
      sscript_code[0xc] = '\0';
      sscript_code[0xd] = '\0';
      sscript_code[0xe] = '\0';
      sscript_code[0xf] = '\0';
      sscript_code[0x10] = '\0';
      sscript_code[0x11] = '\0';
      sscript_code[0x12] = '\0';
      sscript_code[0x13] = '\0';
      sscript_code[0x14] = '\0';
      sscript_code[0x15] = '\0';
      sscript_code[0x16] = '\0';
      sscript_code[0x17] = '\0';
      sregion_code[0x38] = '\0';
      sregion_code[0x39] = '\0';
      sregion_code[0x3a] = '\0';
      sregion_code[0x3b] = '\0';
      sregion_code[0x3c] = '\0';
      sregion_code[0x3d] = '\0';
      sregion_code[0x3e] = '\0';
      sregion_code[0x3f] = '\0';
      sscript_code[0] = '\0';
      sscript_code[1] = '\0';
      sscript_code[2] = '\0';
      sscript_code[3] = '\0';
      sscript_code[4] = '\0';
      sscript_code[5] = '\0';
      sscript_code[6] = '\0';
      sscript_code[7] = '\0';
      sregion_code[0x28] = '\0';
      sregion_code[0x29] = '\0';
      sregion_code[0x2a] = '\0';
      sregion_code[0x2b] = '\0';
      sregion_code[0x2c] = '\0';
      sregion_code[0x2d] = '\0';
      sregion_code[0x2e] = '\0';
      sregion_code[0x2f] = '\0';
      sregion_code[0x30] = '\0';
      sregion_code[0x31] = '\0';
      sregion_code[0x32] = '\0';
      sregion_code[0x33] = '\0';
      sregion_code[0x34] = '\0';
      sregion_code[0x35] = '\0';
      sregion_code[0x36] = '\0';
      sregion_code[0x37] = '\0';
      sregion_code[0x18] = '\0';
      sregion_code[0x19] = '\0';
      sregion_code[0x1a] = '\0';
      sregion_code[0x1b] = '\0';
      sregion_code[0x1c] = '\0';
      sregion_code[0x1d] = '\0';
      sregion_code[0x1e] = '\0';
      sregion_code[0x1f] = '\0';
      sregion_code[0x20] = '\0';
      sregion_code[0x21] = '\0';
      sregion_code[0x22] = '\0';
      sregion_code[0x23] = '\0';
      sregion_code[0x24] = '\0';
      sregion_code[0x25] = '\0';
      sregion_code[0x26] = '\0';
      sregion_code[0x27] = '\0';
      sregion_code[8] = '\0';
      sregion_code[9] = '\0';
      sregion_code[10] = '\0';
      sregion_code[0xb] = '\0';
      sregion_code[0xc] = '\0';
      sregion_code[0xd] = '\0';
      sregion_code[0xe] = '\0';
      sregion_code[0xf] = '\0';
      sregion_code[0x10] = '\0';
      sregion_code[0x11] = '\0';
      sregion_code[0x12] = '\0';
      sregion_code[0x13] = '\0';
      sregion_code[0x14] = '\0';
      sregion_code[0x15] = '\0';
      sregion_code[0x16] = '\0';
      sregion_code[0x17] = '\0';
      ssortorder[0x38] = '\0';
      ssortorder[0x39] = '\0';
      ssortorder[0x3a] = '\0';
      ssortorder[0x3b] = '\0';
      ssortorder[0x3c] = '\0';
      ssortorder[0x3d] = '\0';
      ssortorder[0x3e] = '\0';
      ssortorder[0x3f] = '\0';
      sregion_code[0] = '\0';
      sregion_code[1] = '\0';
      sregion_code[2] = '\0';
      sregion_code[3] = '\0';
      sregion_code[4] = '\0';
      sregion_code[5] = '\0';
      sregion_code[6] = '\0';
      sregion_code[7] = '\0';
      ssortorder[0x28] = '\0';
      ssortorder[0x29] = '\0';
      ssortorder[0x2a] = '\0';
      ssortorder[0x2b] = '\0';
      ssortorder[0x2c] = '\0';
      ssortorder[0x2d] = '\0';
      ssortorder[0x2e] = '\0';
      ssortorder[0x2f] = '\0';
      ssortorder[0x30] = '\0';
      ssortorder[0x31] = '\0';
      ssortorder[0x32] = '\0';
      ssortorder[0x33] = '\0';
      ssortorder[0x34] = '\0';
      ssortorder[0x35] = '\0';
      ssortorder[0x36] = '\0';
      ssortorder[0x37] = '\0';
      ssortorder[0x18] = '\0';
      ssortorder[0x19] = '\0';
      ssortorder[0x1a] = '\0';
      ssortorder[0x1b] = '\0';
      ssortorder[0x1c] = '\0';
      ssortorder[0x1d] = '\0';
      ssortorder[0x1e] = '\0';
      ssortorder[0x1f] = '\0';
      ssortorder[0x20] = '\0';
      ssortorder[0x21] = '\0';
      ssortorder[0x22] = '\0';
      ssortorder[0x23] = '\0';
      ssortorder[0x24] = '\0';
      ssortorder[0x25] = '\0';
      ssortorder[0x26] = '\0';
      ssortorder[0x27] = '\0';
      ssortorder[8] = '\0';
      ssortorder[9] = '\0';
      ssortorder[10] = '\0';
      ssortorder[0xb] = '\0';
      ssortorder[0xc] = '\0';
      ssortorder[0xd] = '\0';
      ssortorder[0xe] = '\0';
      ssortorder[0xf] = '\0';
      ssortorder[0x10] = '\0';
      ssortorder[0x11] = '\0';
      ssortorder[0x12] = '\0';
      ssortorder[0x13] = '\0';
      ssortorder[0x14] = '\0';
      ssortorder[0x15] = '\0';
      ssortorder[0x16] = '\0';
      ssortorder[0x17] = '\0';
      acStack_1c8[0] = '\0';
      acStack_1c8[1] = '\0';
      acStack_1c8[2] = '\0';
      acStack_1c8[3] = '\0';
      acStack_1c8[4] = '\0';
      acStack_1c8[5] = '\0';
      acStack_1c8[6] = '\0';
      acStack_1c8[7] = '\0';
      ssortorder[0] = '\0';
      ssortorder[1] = '\0';
      ssortorder[2] = '\0';
      ssortorder[3] = '\0';
      ssortorder[4] = '\0';
      ssortorder[5] = '\0';
      ssortorder[6] = '\0';
      ssortorder[7] = '\0';
      buffer.m_s._7_1_ =
           ParseName(locale_name_00,language_code_local._4_4_,sextlang_code + 0x38,0x40,
                     sscript_code + 0x38,0x40,sregion_code + 0x38,0x40,ssortorder + 0x38,0x40,
                     acStack_1c8,0x40);
      if ((bool)buffer.m_s._7_1_) {
        bVar2 = ASCIICharToWide(sextlang_code + 0x38,0x40,(wchar_t *)language_code_capacity_local,
                                (size_t)extlang_code_local);
        if (!bVar2) {
          buffer.m_s._7_1_ = 0;
        }
        bVar2 = ASCIICharToWide(sregion_code + 0x38,0x40,script_code,script_code_capacity);
        if (!bVar2) {
          buffer.m_s._7_1_ = 0;
        }
        bVar2 = ASCIICharToWide(ssortorder + 0x38,0x40,region_code,region_code_capacity);
        if (!bVar2) {
          buffer.m_s._7_1_ = 0;
        }
        bVar2 = ASCIICharToWide(acStack_1c8,0x40,sortorder,sortorder_capacity);
        if (!bVar2) {
          buffer.m_s._7_1_ = 0;
        }
        locale_name_local._7_1_ = buffer.m_s._7_1_ & 1;
      }
      else {
        locale_name_local._7_1_ = 0;
      }
LAB_006b152f:
      ON_String::~ON_String(&local_50);
    }
  }
  return (bool)(locale_name_local._7_1_ & 1);
}

Assistant:

bool ON_Locale::ParseName(
  const wchar_t* locale_name,
  int locale_name_element_count,
  wchar_t* language_code,
  size_t language_code_capacity,
  wchar_t* extlang_code,
  size_t extlang_code_capacity,
  wchar_t* script_code,
  size_t script_code_capacity,
  wchar_t* region_code,
  size_t region_code_capacity,
  wchar_t* sortorder,
  size_t sortorder_capacity
  )
{
  bool rc = true;

  if (false == ZeroWideBuffer(language_code, language_code_capacity, sizeof(language_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(extlang_code, extlang_code_capacity, sizeof(extlang_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(script_code, script_code_capacity, sizeof(script_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(region_code, region_code_capacity, sizeof(region_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(sortorder, sortorder_capacity, sizeof(sortorder[0])))
    rc = false;

  if (false == rc)
    return false;

  if ( locale_name_element_count < 0 )
    locale_name_element_count = ON_wString::Length(locale_name);

  if ( 0 == locale_name_element_count )
    return true;

  if ( nullptr == locale_name || 0 == locale_name[0] )
    return false;

  if ( locale_name_element_count < 2 )
    return false;

  ON_String buffer;
  buffer.ReserveArray(locale_name_element_count);
  buffer.SetLength(locale_name_element_count);
  char* sname = buffer.Array();
  for (int i = 0; i < locale_name_element_count; i++)
  {
    const wchar_t w = locale_name[i];
    if ( w > 127 )
      return false; // illegal symbol in language or locale name
    if (0 == w)
    {
      locale_name_element_count = i;
      break;
    }
    sname[i] = (char)w;
  }
  sname[locale_name_element_count] = 0;
  
  const size_t ON_S_CAPACITY = 64;
  char slanguage_code[ON_S_CAPACITY] = { 0 };
  char sextlang_code[ON_S_CAPACITY] = { 0 };
  char sscript_code[ON_S_CAPACITY] = { 0 };
  char sregion_code[ON_S_CAPACITY] = { 0 };
  char ssortorder[ON_S_CAPACITY] = { 0 };

  rc = ON_Locale::ParseName(
    sname,
    locale_name_element_count,
    slanguage_code, ON_S_CAPACITY,
    sextlang_code, ON_S_CAPACITY,
    sscript_code, ON_S_CAPACITY,
    sregion_code, ON_S_CAPACITY,
    ssortorder, ON_S_CAPACITY
    );

  if (!rc)
    return false;

  if ( !ASCIICharToWide(slanguage_code,ON_S_CAPACITY,language_code,language_code_capacity) )
    rc = false;
  if ( !ASCIICharToWide(sscript_code,ON_S_CAPACITY,script_code,script_code_capacity) )
    rc = false;
  if ( !ASCIICharToWide(sregion_code,ON_S_CAPACITY,region_code,region_code_capacity) )
    rc = false;
  if ( !ASCIICharToWide(ssortorder,ON_S_CAPACITY,sortorder,sortorder_capacity) )
    rc = false;

  return rc;
}